

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

FunctionBody * __thiscall
Js::ParseableFunctionInfo::Parse
          (ParseableFunctionInfo *this,ScriptFunction **functionRef,bool isByteCodeDeserialization)

{
  uint uVar1;
  uint uVar2;
  code *pcVar3;
  char16_t *pcVar4;
  ParseNodeProg *pnode;
  ULONG grfscr_00;
  JavascriptMethod this_00;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  BOOL BVar9;
  LocalFunctionId functionID;
  int iVar10;
  uint uVar11;
  charcount_t cVar12;
  uint uVar13;
  uint32 uVar14;
  ULONG lineNumber;
  FunctionInfo *this_01;
  ParseableFunctionInfo *pPVar15;
  undefined4 *puVar16;
  FunctionBody *this_02;
  Utf8SourceInfo *pUVar17;
  SourceContextInfo *pSVar18;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char16 *pcVar19;
  ByteBlock *pBVar20;
  ThreadContext *pTVar21;
  LPCUTF8 pSrc;
  ScriptContext *pSVar22;
  ScopeInfo *parentScopeInfo;
  undefined8 uVar23;
  undefined8 in_stack_fffffffffffff128;
  undefined4 uVar24;
  bool local_e3a;
  byte local_d73;
  byte local_d72;
  byte local_d62;
  OutOfMemoryException anon_var_0;
  StackOverflowException anon_var_0_1;
  NotImplementedException anon_var_0_2;
  ScriptAbortException anon_var_0_3;
  ParseableFunctionInfo *pPStack_c88;
  AsmJsParseException anon_var_0_4;
  ParseableFunctionInfo *rootFunc;
  bool forceNoNative;
  AutoDynamicCodeReference dynamicFunctionReference;
  ParseNodeProg *pPStack_c68;
  uint nextFunctionId;
  ParseNodeProg *parseTree;
  Parser ps;
  CompileScriptException se;
  AutoHandledExceptionType __autoHandledExceptionType;
  uint32 grfscr;
  LPCUTF8 pszStart;
  size_t length;
  charcount_t charOffset;
  size_t offset;
  undefined1 local_128 [7];
  bool isCesu8;
  AutoReentrancyHandler autoReentrancyHandler;
  LeaveScriptObject<true,_false,_false> __leaveScriptObject;
  void *__frameAddr;
  HRESULT local_e0;
  HRESULT hrParseCodeGen;
  HRESULT hrParser;
  HRESULT hr;
  char16 debugStringBuffer [42];
  bool isAsmJsReparse;
  bool isDebugReparse;
  undefined1 local_60 [8];
  AutoRestoreFunctionInfo autoRestoreFunctionInfo;
  FunctionBody *funcBody;
  FunctionBody *pFStack_38;
  bool isDebugOrAsmJsReparse;
  FunctionBody *returnFunctionBody;
  BOOL fParsed;
  bool asmjsParseFailed;
  bool isByteCodeDeserialization_local;
  ScriptFunction **functionRef_local;
  ParseableFunctionInfo *this_local;
  
  uVar24 = (undefined4)((ulong)in_stack_fffffffffffff128 >> 0x20);
  this_01 = FunctionProxy::GetFunctionInfo(&this->super_FunctionProxy);
  pPVar15 = (ParseableFunctionInfo *)FunctionInfo::GetFunctionProxy(this_01);
  if (this != pPVar15) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar16 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x8f2,"(this == this->GetFunctionInfo()->GetFunctionProxy())",
                                "this == this->GetFunctionInfo()->GetFunctionProxy()");
    if (!bVar5) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar16 = 0;
  }
  BVar9 = FunctionProxy::IsDeferredParseFunction(&this->super_FunctionProxy);
  if (BVar9 == 0) {
    this_02 = FunctionProxy::GetFunctionBody(&this->super_FunctionProxy);
    bVar5 = IsFunctionParsed(&this_02->super_ParseableFunctionInfo);
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x8f6,"(GetFunctionBody()->IsFunctionParsed())",
                                  "GetFunctionBody()->IsFunctionParsed()");
      if (!bVar5) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 0;
    }
    this_local = &FunctionProxy::GetFunctionBody(&this->super_FunctionProxy)->
                  super_ParseableFunctionInfo;
  }
  else {
    bVar5 = false;
    bVar8 = false;
    pFStack_38 = (FunctionBody *)0x0;
    funcBody._7_1_ = 0;
    autoRestoreFunctionInfo.originalEntryPoint = (JavascriptMethod)0x0;
    AutoRestoreFunctionInfo::AutoRestoreFunctionInfo
              ((AutoRestoreFunctionInfo *)local_60,this,
               InterpreterStackFrame::DelayDynamicInterpreterThunk);
    if ((*(ushort *)&(this->super_FunctionProxy).field_0x45 >> 1 & 1) == 0) {
      pUVar17 = FunctionProxy::GetUtf8SourceInfo(&this->super_FunctionProxy);
      functionID = FunctionProxy::GetLocalFunctionId(&this->super_FunctionProxy);
      Utf8SourceInfo::StopTrackingDeferredFunction(pUVar17,functionID);
      autoRestoreFunctionInfo.pfi =
           &FunctionBody::NewFromParseableFunctionInfo(this)->super_ParseableFunctionInfo;
      autoRestoreFunctionInfo.originalEntryPoint = (JavascriptMethod)autoRestoreFunctionInfo.pfi;
      pSVar18 = FunctionProxy::GetSourceContextInfo(&this->super_FunctionProxy);
      bVar6 = SourceContextInfo::IsDynamic(pSVar18);
      if (bVar6) {
        bVar6 = Phases::IsEnabled((Phases *)&DAT_01ec73f0,DeferParsePhase);
        if (bVar6) {
          uVar1 = (this->super_FunctionProxy).m_functionNumber;
          iVar10 = (*(this->super_FunctionProxy).super_FinalizableObject.
                     super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
          uVar2 = this->m_cchLength;
          uVar11 = GetNestedCount(this);
          pUVar17 = Memory::WriteBarrierPtr<Js::Utf8SourceInfo>::operator->
                              (&(this->super_FunctionProxy).m_utf8SourceInfo);
          uVar13 = Utf8SourceInfo::GetSourceInfoId(pUVar17);
          pUVar17 = Memory::WriteBarrierPtr<Js::Utf8SourceInfo>::operator->
                              (&(this->super_FunctionProxy).m_utf8SourceInfo);
          cVar12 = Utf8SourceInfo::GetCchLength(pUVar17);
          bVar6 = FunctionProxy::GetIsTopLevel(&this->super_FunctionProxy);
          pcVar4 = L"LdFalse";
          if (bVar6) {
            pcVar4 = L"LdTrue";
          }
          Output::Print(L"TestTrace: Deferred function parsed - ID: %d; Display Name: %s; Length: %d; Nested Function Count: %d; Utf8SourceInfo: %d; Source Length: %d\n; Is Top Level: %s;"
                        ,(ulong)uVar1,CONCAT44(extraout_var_00,iVar10),(ulong)uVar2,(ulong)uVar11,
                        (ulong)uVar13,CONCAT44(uVar24,cVar12),pcVar4 + 2);
          Output::Flush();
        }
      }
      else {
        bVar6 = Phases::IsEnabled((Phases *)&DAT_01ec73f0,DeferParsePhase);
        if (bVar6) {
          uVar1 = (this->super_FunctionProxy).m_functionNumber;
          iVar10 = (*(this->super_FunctionProxy).super_FinalizableObject.
                     super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
          uVar2 = this->m_cchLength;
          uVar11 = GetNestedCount(this);
          pUVar17 = Memory::WriteBarrierPtr<Js::Utf8SourceInfo>::operator->
                              (&(this->super_FunctionProxy).m_utf8SourceInfo);
          uVar13 = Utf8SourceInfo::GetSourceInfoId(pUVar17);
          pUVar17 = Memory::WriteBarrierPtr<Js::Utf8SourceInfo>::operator->
                              (&(this->super_FunctionProxy).m_utf8SourceInfo);
          cVar12 = Utf8SourceInfo::GetCchLength(pUVar17);
          bVar6 = FunctionProxy::GetIsTopLevel(&this->super_FunctionProxy);
          pcVar4 = L"LdFalse";
          if (bVar6) {
            pcVar4 = L"LdTrue";
          }
          pSVar18 = FunctionProxy::GetSourceContextInfo(&this->super_FunctionProxy);
          Output::Print(L"TestTrace: Deferred function parsed - ID: %d; Display Name: %s; Length: %d; Nested Function Count: %d; Utf8SourceInfo: %d; Source Length: %d; Is Top Level: %s; Source Url: %s\n"
                        ,(ulong)uVar1,CONCAT44(extraout_var,iVar10),(ulong)uVar2,(ulong)uVar11,
                        (ulong)uVar13,CONCAT44(uVar24,cVar12),pcVar4 + 2,
                        (pSVar18->field_5).field_0.url);
          Output::Flush();
        }
      }
      bVar6 = FunctionProxy::GetIsTopLevel(&this->super_FunctionProxy);
      if (!bVar6) {
        pSVar18 = FunctionProxy::GetSourceContextInfo(&this->super_FunctionProxy);
        bVar6 = SourceContextInfo::IsDynamic(pSVar18);
        if ((!bVar6) &&
           (bVar6 = ScriptContext::DoUndeferGlobalFunctions
                              ((this->super_FunctionProxy).m_scriptContext), bVar6)) {
          pUVar17 = FunctionProxy::GetUtf8SourceInfo(&this->super_FunctionProxy);
          Utf8SourceInfo::
          UndeferGlobalFunctions<Js::ParseableFunctionInfo::Parse(Js::ScriptFunction**,bool)::__0>
                    (pUVar17,(anon_class_8_1_8991fb9c)this);
        }
      }
    }
    else {
      bVar6 = ScriptContext::IsScriptContextInSourceRundownOrDebugMode
                        ((this->super_FunctionProxy).m_scriptContext);
      local_d62 = 0;
      if (bVar6) {
        pUVar17 = FunctionProxy::GetUtf8SourceInfo(&this->super_FunctionProxy);
        bVar6 = Utf8SourceInfo::GetIsLibraryCode(pUVar17);
        local_d62 = bVar6 ^ 0xff;
      }
      local_d72 = 0;
      if ((*(ushort *)&(this->super_FunctionProxy).field_0x45 >> 9 & 1) != 0) {
        local_d72 = local_d62 & 1 ^ 0xff;
      }
      local_d73 = 1;
      if ((local_d72 & 1) == 0) {
        local_d73 = local_d62 & 1;
      }
      funcBody._7_1_ = local_d73;
      autoRestoreFunctionInfo.originalEntryPoint =
           (JavascriptMethod)FunctionProxy::GetFunctionBody(&this->super_FunctionProxy);
      AutoRestoreFunctionInfo::Clear((AutoRestoreFunctionInfo *)local_60);
      if (local_d73 != 0) {
        bVar6 = IsReparsed((ParseableFunctionInfo *)autoRestoreFunctionInfo.originalEntryPoint);
        if (((!bVar6) &&
            (bVar6 = ScriptContext::IsScriptContextInSourceRundownOrDebugMode
                               ((this->super_FunctionProxy).m_scriptContext), !bVar6)) &&
           ((*(ushort *)&(this->super_FunctionProxy).field_0x45 >> 9 & 1) == 0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar16 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                      ,0x955,
                                      "(funcBody->IsReparsed() || m_scriptContext->IsScriptContextInSourceRundownOrDebugMode() || m_isAsmjsMode)"
                                      ,
                                      "funcBody->IsReparsed() || m_scriptContext->IsScriptContextInSourceRundownOrDebugMode() || m_isAsmjsMode"
                                     );
          if (!bVar6) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar16 = 0;
        }
        uVar23 = (**(code **)(*(long *)autoRestoreFunctionInfo.originalEntryPoint + 0x38))();
        pcVar19 = FunctionProxy::GetDebugNumberSet
                            ((FunctionProxy *)autoRestoreFunctionInfo.originalEntryPoint,
                             (wchar (*) [42])&hrParser);
        Output::Trace(DebuggerPhase,L"Full nested reparse of function: %s (%s)\n",uVar23,pcVar19);
        pBVar20 = FunctionBody::GetByteCode
                            ((FunctionBody *)autoRestoreFunctionInfo.originalEntryPoint);
        if (pBVar20 != (ByteBlock *)0x0) {
          CleanupToReparse((ParseableFunctionInfo *)autoRestoreFunctionInfo.originalEntryPoint);
        }
      }
    }
    pBVar20 = FunctionBody::GetByteCode((FunctionBody *)autoRestoreFunctionInfo.originalEntryPoint);
    if (pBVar20 == (ByteBlock *)0x0) {
      bVar6 = FunctionBody::HasExecutionDynamicProfileInfo
                        ((FunctionBody *)autoRestoreFunctionInfo.originalEntryPoint);
      if (bVar6) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0x968,"(!funcBody->HasExecutionDynamicProfileInfo())",
                                    "!funcBody->HasExecutionDynamicProfileInfo()");
        if (!bVar6) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 0;
      }
      hrParseCodeGen = 0;
      local_e0 = 0;
      LeaveScriptObject<true,_false,_false>::LeaveScriptObject
                ((LeaveScriptObject<true,_false,_false> *)
                 &autoReentrancyHandler.m_savedReentrancySafeOrHandled,
                 (this->super_FunctionProxy).m_scriptContext,&stack0xfffffffffffffff8);
      pTVar21 = ScriptContext::GetThreadContext((this->super_FunctionProxy).m_scriptContext);
      AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_128,pTVar21);
      pSVar22 = (this->super_FunctionProxy).m_scriptContext;
      uVar11 = GetSourceIndex((ParseableFunctionInfo *)autoRestoreFunctionInfo.originalEntryPoint);
      pUVar17 = ScriptContext::GetSource(pSVar22,uVar11);
      bVar6 = Utf8SourceInfo::IsCesu8(pUVar17);
      uVar11 = StartOffset(this);
      cVar12 = StartInDocument(this);
      uVar13 = LengthInBytes(this);
      pSrc = GetStartOfDocument(this,(char16 *)0x0);
      uVar14 = GetGrfscr((ParseableFunctionInfo *)autoRestoreFunctionInfo.originalEntryPoint);
      se.bstrLine._4_4_ = uVar14 | 0x800000;
      bVar7 = GetIsGlobalFunc((ParseableFunctionInfo *)autoRestoreFunctionInfo.originalEntryPoint);
      if (!bVar7) {
        se.bstrLine._4_4_ = se.bstrLine._4_4_ & 0xffffefff;
      }
      bVar7 = GetIsDeclaration((ParseableFunctionInfo *)autoRestoreFunctionInfo.originalEntryPoint);
      if ((!bVar7) &&
         (bVar7 = GetIsGlobalFunc((ParseableFunctionInfo *)
                                  autoRestoreFunctionInfo.originalEntryPoint), !bVar7)) {
        se.bstrLine._4_4_ = se.bstrLine._4_4_ | 0x1000000;
      }
      bVar7 = IsMethod((ParseableFunctionInfo *)autoRestoreFunctionInfo.originalEntryPoint);
      if (bVar7) {
        se.bstrLine._4_4_ = se.bstrLine._4_4_ | 0x4000000;
      }
      else {
        se.bstrLine._4_4_ = se.bstrLine._4_4_ & 0xfbffffff;
      }
      bVar7 = FunctionProxy::IsAsync((FunctionProxy *)autoRestoreFunctionInfo.originalEntryPoint);
      if (bVar7) {
        se.bstrLine._4_4_ = se.bstrLine._4_4_ | 0x2000000;
      }
      else {
        se.bstrLine._4_4_ = se.bstrLine._4_4_ & 0xfdffffff;
      }
      bVar7 = FunctionProxy::IsGenerator
                        ((FunctionProxy *)autoRestoreFunctionInfo.originalEntryPoint);
      if (bVar7) {
        se.bstrLine._4_4_ = se.bstrLine._4_4_ | 0x8000000;
      }
      else {
        se.bstrLine._4_4_ = se.bstrLine._4_4_ & 0xf7ffffff;
      }
      bVar7 = FunctionProxy::IsClassConstructor
                        ((FunctionProxy *)autoRestoreFunctionInfo.originalEntryPoint);
      if (bVar7) {
        se.bstrLine._4_4_ = se.bstrLine._4_4_ | 0x20000000;
      }
      else {
        se.bstrLine._4_4_ = se.bstrLine._4_4_ & 0xdfffffff;
      }
      bVar7 = FunctionProxy::IsBaseClassConstructor
                        ((FunctionProxy *)autoRestoreFunctionInfo.originalEntryPoint);
      if (bVar7) {
        se.bstrLine._4_4_ = se.bstrLine._4_4_ | 0x40000000;
      }
      else {
        se.bstrLine._4_4_ = se.bstrLine._4_4_ & 0xbfffffff;
      }
      bVar7 = FunctionProxy::IsClassMethod
                        ((FunctionProxy *)autoRestoreFunctionInfo.originalEntryPoint);
      if (bVar7) {
        se.bstrLine._4_4_ = se.bstrLine._4_4_ | 0x10000000;
      }
      else {
        se.bstrLine._4_4_ = se.bstrLine._4_4_ & 0xefffffff;
      }
      if (funcBody._7_1_ != 0) {
        se.bstrLine._4_4_ = se.bstrLine._4_4_ & 0xfffffef7 | 0x4000;
      }
      AutoHandledExceptionType::AutoHandledExceptionType
                ((AutoHandledExceptionType *)((long)&se.bstrLine + 3),
                 ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
      CompileScriptException::CompileScriptException((CompileScriptException *)&ps.m_deferringAST);
      pSVar22 = (this->super_FunctionProxy).m_scriptContext;
      bVar7 = GetIsStrictMode((ParseableFunctionInfo *)autoRestoreFunctionInfo.originalEntryPoint);
      Parser::Parser((Parser *)&parseTree,pSVar22,(uint)bVar7,(PageAllocator *)0x0,false,0xaa8);
      pPStack_c68 = (ParseNodeProg *)0x0;
      dynamicFunctionReference.m_scriptContext._4_4_ =
           FunctionProxy::GetLocalFunctionId
                     ((FunctionProxy *)autoRestoreFunctionInfo.originalEntryPoint);
      grfscr_00 = se.bstrLine._4_4_;
      lineNumber = GetRelativeLineNumber
                             ((ParseableFunctionInfo *)autoRestoreFunctionInfo.originalEntryPoint);
      pSVar18 = FunctionProxy::GetSourceContextInfo
                          ((FunctionProxy *)autoRestoreFunctionInfo.originalEntryPoint);
      local_e0 = Parser::ParseSourceWithOffset
                           ((Parser *)&parseTree,&stack0xfffffffffffff398,pSrc,(ulong)uVar11,
                            (ulong)uVar13,cVar12,bVar6,grfscr_00,
                            (CompileScriptException *)&ps.m_deferringAST,
                            (LocalFunctionId *)((long)&dynamicFunctionReference.m_scriptContext + 4)
                            ,lineNumber,pSVar18,
                            (ParseableFunctionInfo *)autoRestoreFunctionInfo.originalEntryPoint);
      if (local_e0 < 0) {
        __frameAddr._4_4_ =
             MapDeferredReparseError(&local_e0,(CompileScriptException *)&ps.m_deferringAST);
        if ((__frameAddr._4_4_ != -0x7ff5ebe4) && ((-1 < __frameAddr._4_4_ || (local_e0 < 0)))) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar16 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                      ,0x9d7,
                                      "(hrParseCodeGen == JSERR_AsmJsCompileError || (((HRESULT)(hrParseCodeGen)<0) && ((HRESULT)(hrParser) >= 0)))"
                                      ,"Syntax errors should never be detected on deferred re-parse"
                                     );
          if (!bVar6) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar16 = 0;
        }
      }
      else {
        bVar6 = Phases::IsEnabled((Phases *)&DAT_01ec1678,ByteCodePhase);
        if (bVar6) {
          uVar23 = (**(code **)(*(long *)autoRestoreFunctionInfo.originalEntryPoint + 0x38))();
          Output::Print(L"\nDeferred parse %s\n",uVar23);
        }
        AutoDynamicCodeReference::AutoDynamicCodeReference
                  ((AutoDynamicCodeReference *)&stack0xfffffffffffff388,
                   (this->super_FunctionProxy).m_scriptContext);
        if (funcBody._7_1_ == 0) {
          local_e3a = false;
        }
        else {
          pSVar22 = FunctionProxy::GetScriptContext(&this->super_FunctionProxy);
          local_e3a = ScriptContext::IsInterpreted(pSVar22);
        }
        pPStack_c88 = FunctionProxy::GetParseableFunctionInfo
                                ((FunctionProxy *)autoRestoreFunctionInfo.originalEntryPoint);
        uVar14 = se.bstrLine._4_4_;
        pnode = pPStack_c68;
        pSVar22 = (this->super_FunctionProxy).m_scriptContext;
        uVar11 = GetSourceIndex((ParseableFunctionInfo *)autoRestoreFunctionInfo.originalEntryPoint)
        ;
        parentScopeInfo =
             GetScopeInfo((ParseableFunctionInfo *)autoRestoreFunctionInfo.originalEntryPoint);
        __frameAddr._4_4_ =
             GenerateByteCode(pnode,uVar14,pSVar22,&stack0xfffffffffffff378,uVar11,local_e3a,
                              (Parser *)&parseTree,(CompileScriptException *)&ps.m_deferringAST,
                              parentScopeInfo,functionRef);
        FunctionProxy::SetParseableFunctionInfo
                  ((FunctionProxy *)autoRestoreFunctionInfo.originalEntryPoint,pPStack_c88);
        if (__frameAddr._4_4_ < 0) {
          if (__frameAddr._4_4_ != -0x7999bffc) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar16 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                        ,0x9ec,"(hrParseCodeGen == ((HRESULT)0x86664004L))",
                                        "hrParseCodeGen == SCRIPT_E_RECORDED");
            if (!bVar6) {
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar16 = 0;
          }
          __frameAddr._4_4_ = (HRESULT)se.super_ScriptException.ei.pfnDeferredFillIn;
        }
        else {
          bVar8 = true;
        }
        AutoDynamicCodeReference::~AutoDynamicCodeReference
                  ((AutoDynamicCodeReference *)&stack0xfffffffffffff388);
      }
      Parser::~Parser((Parser *)&parseTree);
      CompileScriptException::~CompileScriptException((CompileScriptException *)&ps.m_deferringAST);
      AutoHandledExceptionType::~AutoHandledExceptionType
                ((AutoHandledExceptionType *)((long)&se.bstrLine + 3));
      if ((this->super_FunctionProxy).m_scriptContext != (Type)0x0) {
        pTVar21 = ScriptContext::GetThreadContext((this->super_FunctionProxy).m_scriptContext);
        ThreadContext::DisposeOnLeaveScript(pTVar21);
      }
      AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_128);
      LeaveScriptObject<true,_false,_false>::~LeaveScriptObject
                ((LeaveScriptObject<true,_false,_false> *)
                 &autoReentrancyHandler.m_savedReentrancySafeOrHandled);
      if (hrParseCodeGen == -0x7ff8fff2) {
        JavascriptError::ThrowOutOfMemoryError((this->super_FunctionProxy).m_scriptContext);
      }
      if (hrParseCodeGen == -0x7ff5ffe4) {
        JavascriptError::ThrowStackOverflowError
                  ((this->super_FunctionProxy).m_scriptContext,(PVOID)0x0);
      }
      if (hrParseCodeGen == -0x7fffbfff) {
        uVar23 = __cxa_allocate_exception(1);
        __cxa_throw(uVar23,&NotImplementedException::typeinfo,0);
      }
      if (hrParseCodeGen == -0x7fffbffc) {
        uVar23 = __cxa_allocate_exception(1);
        __cxa_throw(uVar23,&ScriptAbortException::typeinfo,0);
      }
      if (hrParseCodeGen == -0x7ff5ebe4) {
        uVar23 = __cxa_allocate_exception(1);
        __cxa_throw(uVar23,&AsmJsParseException::typeinfo,0);
      }
      if (hrParseCodeGen < 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0x9f5,"(false)","false");
        if (!bVar6) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 0;
      }
      if (hrParseCodeGen != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0x9f7,"(hr == 0L)","hr == NO_ERROR");
        if (!bVar6) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 0;
      }
      if (local_e0 < 0) {
        JavascriptError::ThrowError
                  ((this->super_FunctionProxy).m_scriptContext,-0x7ff5ffcd,(PCWSTR)0x0);
      }
      if (__frameAddr._4_4_ < 0) {
        if (__frameAddr._4_4_ == -0x7ff5ffe4) {
          JavascriptError::ThrowStackOverflowError
                    ((this->super_FunctionProxy).m_scriptContext,(PVOID)0x0);
        }
        if (__frameAddr._4_4_ != -0x7ff5ebe4) {
          JavascriptError::MapAndThrowError
                    ((this->super_FunctionProxy).m_scriptContext,__frameAddr._4_4_);
        }
        bVar5 = true;
      }
    }
    else {
      bVar8 = false;
    }
    if (!bVar5) {
      AutoRestoreFunctionInfo::Clear((AutoRestoreFunctionInfo *)local_60);
    }
    AutoRestoreFunctionInfo::~AutoRestoreFunctionInfo((AutoRestoreFunctionInfo *)local_60);
    this_00 = autoRestoreFunctionInfo.originalEntryPoint;
    if (bVar8) {
      bVar8 = GetIsNameIdentifierRef(this);
      SetIsNameIdentifierRef((ParseableFunctionInfo *)this_00,bVar8);
      *(ushort *)&(this->super_FunctionProxy).field_0x45 =
           *(ushort *)&(this->super_FunctionProxy).field_0x45 & 0xfffd | 2;
      pFStack_38 = (FunctionBody *)autoRestoreFunctionInfo.originalEntryPoint;
    }
    else if (!bVar5) {
      pFStack_38 = FunctionProxy::GetFunctionBody(&this->super_FunctionProxy);
    }
    if (bVar5) {
      this->m_grfscr = this->m_grfscr | 0x4000;
      this_local = &Parse(this,functionRef,isByteCodeDeserialization)->super_ParseableFunctionInfo;
    }
    else {
      this_local = &pFStack_38->super_ParseableFunctionInfo;
    }
  }
  return (FunctionBody *)this_local;
}

Assistant:

FunctionBody* ParseableFunctionInfo::Parse(ScriptFunction ** functionRef, bool isByteCodeDeserialization)
    {
        Assert(this == this->GetFunctionInfo()->GetFunctionProxy());
        if (!IsDeferredParseFunction())
        {
            // If not deferredparsed, the functionBodyImpl and this will be the same, just return the current functionBody.
            Assert(GetFunctionBody()->IsFunctionParsed());
            return GetFunctionBody();
        }

        bool asmjsParseFailed = false;
        BOOL fParsed = FALSE;
        FunctionBody* returnFunctionBody = nullptr;

        bool isDebugOrAsmJsReparse = false;
        FunctionBody* funcBody = nullptr;

        {
            AutoRestoreFunctionInfo autoRestoreFunctionInfo(this, DefaultEntryThunk);


            // If m_hasBeenParsed = true, one of the following things happened things happened:
            // - We had multiple function objects which were all defer-parsed, but with the same function body and one of them
            //   got the body to be parsed before another was called
            // - We are in debug mode and had our thunks switched to DeferParseThunk
            // - This is an already parsed asm.js module, which has been invalidated at link time and must be reparsed as a non-asm.js function
            if (!this->m_hasBeenParsed)
            {
                this->GetUtf8SourceInfo()->StopTrackingDeferredFunction(this->GetLocalFunctionId());
                funcBody = FunctionBody::NewFromParseableFunctionInfo(this);
                autoRestoreFunctionInfo.funcBody = funcBody;

                PERF_COUNTER_DEC(Code, DeferredFunction);

                if (!this->GetSourceContextInfo()->IsDynamic())
                {
                    PHASE_PRINT_TESTTRACE1(Js::DeferParsePhase, _u("TestTrace: Deferred function parsed - ID: %d; Display Name: %s; Length: %d; Nested Function Count: %d; Utf8SourceInfo: %d; Source Length: %d; Is Top Level: %s; Source Url: %s\n"), m_functionNumber, this->GetDisplayName(), this->m_cchLength, this->GetNestedCount(), this->m_utf8SourceInfo->GetSourceInfoId(), this->m_utf8SourceInfo->GetCchLength(), this->GetIsTopLevel() ? _u("True") : _u("False"), this->GetSourceContextInfo()->url);
                }
                else
                {
                    PHASE_PRINT_TESTTRACE1(Js::DeferParsePhase, _u("TestTrace: Deferred function parsed - ID: %d; Display Name: %s; Length: %d; Nested Function Count: %d; Utf8SourceInfo: %d; Source Length: %d\n; Is Top Level: %s;"), m_functionNumber, this->GetDisplayName(), this->m_cchLength, this->GetNestedCount(),  this->m_utf8SourceInfo->GetSourceInfoId(), this->m_utf8SourceInfo->GetCchLength(), this->GetIsTopLevel() ? _u("True") : _u("False"));
                }

                if (!this->GetIsTopLevel() &&
                    !this->GetSourceContextInfo()->IsDynamic() &&
                    this->m_scriptContext->DoUndeferGlobalFunctions())
                {
                    this->GetUtf8SourceInfo()->UndeferGlobalFunctions([this](const Utf8SourceInfo::DeferredFunctionsDictionary::EntryType& func)
                    {
                        Js::ParseableFunctionInfo *nextFunc = func.Value();
                        JavascriptExceptionObject* pExceptionObject = nullptr;

                        if (nextFunc != nullptr && this != nextFunc)
                        {
                            try
                            {
                                nextFunc->Parse();
                            }
                            catch (OutOfMemoryException) {}
                            catch (StackOverflowException) {}
                            catch (const Js::JavascriptException& err)
                            {
                                pExceptionObject = err.GetAndClear();
                            }

                            // Do not do anything with an OOM or SOE, returning true is fine, it will then be undeferred (or attempted to again when called)
                            if (pExceptionObject)
                            {
                                if (pExceptionObject != ThreadContext::GetContextForCurrentThread()->GetPendingOOMErrorObject() &&
                                    pExceptionObject != ThreadContext::GetContextForCurrentThread()->GetPendingSOErrorObject())
                                {
                                    JavascriptExceptionOperators::DoThrow(pExceptionObject, /*scriptContext*/nullptr);
                                }
                            }
                        }

                        return true;
                    });
                }
            }
            else
            {
                bool isDebugReparse = m_scriptContext->IsScriptContextInSourceRundownOrDebugMode() && !this->GetUtf8SourceInfo()->GetIsLibraryCode();
                bool isAsmJsReparse = m_isAsmjsMode && !isDebugReparse;

                isDebugOrAsmJsReparse = isAsmJsReparse || isDebugReparse;

                funcBody = this->GetFunctionBody();

                // As we have a valid function body already clear the restore data
                autoRestoreFunctionInfo.Clear();

                if (isDebugOrAsmJsReparse)
                {
#if ENABLE_DEBUG_CONFIG_OPTIONS
                    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
#if DBG
                    Assert(
                        funcBody->IsReparsed()
                        || m_scriptContext->IsScriptContextInSourceRundownOrDebugMode()
                        || m_isAsmjsMode);
#endif
                    OUTPUT_TRACE(Js::DebuggerPhase, _u("Full nested reparse of function: %s (%s)\n"), funcBody->GetDisplayName(), funcBody->GetDebugNumberSet(debugStringBuffer));

                    if (funcBody->GetByteCode())
                    {
                        // The current function needs to be cleaned up before getting generated in the debug mode.
                        funcBody->CleanupToReparse();
                    }

                }
            }

            // Note that we may be trying to re-gen an already-completed function. (This can happen, for instance,
            // in the case of named function expressions inside "with" statements in compat mode.)
            // In such a case, there's no work to do.
            if (funcBody->GetByteCode() == nullptr)
            {
#if ENABLE_PROFILE_INFO
                Assert(!funcBody->HasExecutionDynamicProfileInfo());
#endif
                // In debug or asm.js mode, the scriptlet will be asked to recompile again.

                HRESULT hr = NO_ERROR;
                HRESULT hrParser = NO_ERROR;
                HRESULT hrParseCodeGen = NO_ERROR;

                BEGIN_LEAVE_SCRIPT_INTERNAL(m_scriptContext)
                {
                    bool isCesu8 = m_scriptContext->GetSource(funcBody->GetSourceIndex())->IsCesu8();

                    size_t offset = this->StartOffset();
                    charcount_t charOffset = this->StartInDocument();
                    size_t length = this->LengthInBytes();

                    LPCUTF8 pszStart = this->GetStartOfDocument();

                    uint32 grfscr = funcBody->GetGrfscr() | fscrDeferredFnc;

                    // For the global function we want to re-use the glo functionbody which is already created in the non-debug mode
                    if (!funcBody->GetIsGlobalFunc())
                    {
                        grfscr &= ~fscrGlobalCode;
                    }

                    if (!funcBody->GetIsDeclaration() && !funcBody->GetIsGlobalFunc()) // No refresh may reparse global function (e.g. eval code)
                    {
                        // Notify the parser that the top-level function was defined in an expression,
                        // (not a function declaration statement).
                        grfscr |= fscrDeferredFncExpression;
                    }

                    if (funcBody->IsMethod())
                    {
                        grfscr |= fscrDeferredFncIsMethod;
                    }
                    else
                    {
                        grfscr &= ~fscrDeferredFncIsMethod;
                    }

                    if (funcBody->IsAsync())
                    {
                        grfscr |= fscrDeferredFncIsAsync;
                    }
                    else
                    {
                        grfscr &= ~fscrDeferredFncIsAsync;
                    }

                    if (funcBody->IsGenerator())
                    {
                        grfscr |= fscrDeferredFncIsGenerator;
                    }
                    else
                    {
                        grfscr &= ~fscrDeferredFncIsGenerator;
                    }

                    if (funcBody->IsClassConstructor())
                    {
                        grfscr |= fscrDeferredFncIsClassConstructor;
                    }
                    else
                    {
                        grfscr &= ~fscrDeferredFncIsClassConstructor;
                    }

                    if (funcBody->IsBaseClassConstructor())
                    {
                        grfscr |= fscrDeferredFncIsBaseClassConstructor;
                    }
                    else
                    {
                        grfscr &= ~fscrDeferredFncIsBaseClassConstructor;
                    }

                    if (funcBody->IsClassMethod())
                    {
                        grfscr |= fscrDeferredFncIsClassMember;
                    }
                    else
                    {
                        grfscr &= ~fscrDeferredFncIsClassMember;
                    }

                    if (isDebugOrAsmJsReparse)
                    {
                        // Disable deferred parsing if not DeferNested, or doing a debug/asm.js re-parse
                        // Disable asm.js when debugging or if linking failed
                        // Disable parser state cache if we're debugging or reparsing asm.js
                        grfscr = fscrNoAsmJs | (grfscr & ~(fscrWillDeferFncParse | fscrCreateParserState));
                    }

                    BEGIN_TRANSLATE_EXCEPTION_TO_HRESULT
                    {
                        CompileScriptException se;
                        Parser ps(m_scriptContext, funcBody->GetIsStrictMode() ? TRUE : FALSE);
                        ParseNodeProg * parseTree = nullptr;

                        uint nextFunctionId = funcBody->GetLocalFunctionId();
                        hrParser = ps.ParseSourceWithOffset(&parseTree, pszStart, offset, length, charOffset, isCesu8, grfscr, &se,
                            &nextFunctionId, funcBody->GetRelativeLineNumber(), funcBody->GetSourceContextInfo(),
                            funcBody);
                        // Assert(FAILED(hrParser) || nextFunctionId == funcBody->deferredParseNextFunctionId || isDebugOrAsmJsReparse || isByteCodeDeserialization);

                        if (FAILED(hrParser))
                        {
                            hrParseCodeGen = MapDeferredReparseError(hrParser, se); // Map certain errors like OOM/SOE
                            AssertMsg(hrParseCodeGen == JSERR_AsmJsCompileError // AsmJsCompileError is not a syntax error
                                || (FAILED(hrParseCodeGen) && SUCCEEDED(hrParser)), "Syntax errors should never be detected on deferred re-parse");
                        }
                        else
                        {
                            TRACE_BYTECODE(_u("\nDeferred parse %s\n"), funcBody->GetDisplayName());
                            Js::AutoDynamicCodeReference dynamicFunctionReference(m_scriptContext);

                            bool forceNoNative = isDebugOrAsmJsReparse ? this->GetScriptContext()->IsInterpreted() : false;

                            ParseableFunctionInfo* rootFunc = funcBody->GetParseableFunctionInfo();
                            hrParseCodeGen = GenerateByteCode(parseTree, grfscr, m_scriptContext,
                                &rootFunc, funcBody->GetSourceIndex(),
                                forceNoNative, &ps, &se, funcBody->GetScopeInfo(), functionRef);
                            funcBody->SetParseableFunctionInfo(rootFunc);

                            if (SUCCEEDED(hrParseCodeGen))
                            {
                                fParsed = TRUE;
                            }
                            else
                            {
                                Assert(hrParseCodeGen == SCRIPT_E_RECORDED);
                                hrParseCodeGen = se.ei.scode;
                            }
                        }
                    }
                    END_TRANSLATE_EXCEPTION_TO_HRESULT(hr);
                }
                END_LEAVE_SCRIPT_INTERNAL(m_scriptContext);

                THROW_KNOWN_HRESULT_EXCEPTIONS(hr, m_scriptContext);

                Assert(hr == NO_ERROR);

                if (!SUCCEEDED(hrParser))
                {
                    JavascriptError::ThrowError(m_scriptContext, VBSERR_InternalError);
                }
                else if (!SUCCEEDED(hrParseCodeGen))
                {
                    /*
                     * VBSERR_OutOfStack is of type kjstError but we throw a (more specific) StackOverflowError when a hard stack
                     * overflow occurs. To keep the behavior consistent I'm special casing it here.
                     */
                    if (hrParseCodeGen == VBSERR_OutOfStack)
                    {
                        JavascriptError::ThrowStackOverflowError(m_scriptContext);
                    }
                    else if (hrParseCodeGen == JSERR_AsmJsCompileError)
                    {
                        asmjsParseFailed = true;
                    }
                    else
                    {
                        JavascriptError::MapAndThrowError(m_scriptContext, hrParseCodeGen);
                    }
                }
            }
            else
            {
                fParsed = FALSE;
            }